

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBodyJointLocationsHTC *value)

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  ValidateXrFlagsResult VVar2;
  XrResult XVar3;
  allocator local_729;
  string local_728 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_708;
  allocator local_6e9;
  string local_6e8 [32];
  uint local_6c8;
  allocator local_6c1;
  uint32_t value_jointlocations_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6a0;
  allocator local_681;
  string local_680 [39];
  allocator local_659;
  string local_658 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_638;
  allocator local_619;
  string local_618 [32];
  string local_5f8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5d8;
  allocator local_5b9;
  string local_5b8 [32];
  string local_598 [32];
  ostringstream local_578 [8];
  ostringstream oss_enum_1;
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_390;
  allocator local_371;
  string local_370 [32];
  string local_350 [32];
  ostringstream local_330 [8];
  ostringstream oss_enum;
  allocator local_1b1;
  ValidateXrFlagsResult space_location_flags_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrBodyJointLocationsHTC *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_BODY_JOINT_LOCATIONS_HTC) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrBodyJointLocationsHTC",value->type,
               "VUID-XrBodyJointLocationsHTC-type-type",XR_TYPE_BODY_JOINT_LOCATIONS_HTC,
               "XR_TYPE_BODY_JOINT_LOCATIONS_HTC");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"VUID-XrBodyJointLocationsHTC-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrBodyJointLocationsHTC struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrBodyJointLocationsHTC : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"VUID-XrBodyJointLocationsHTC-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&space_location_flags_result,
                 "Multiple structures of the same type(s) in \"next\" chain for XrBodyJointLocationsHTC struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)&space_location_flags_result);
      std::__cxx11::string::~string((string *)&space_location_flags_result);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    VVar2 = ValidateXrSpaceLocationFlags(value->combinedLocationFlags);
    if (VVar2 == VALIDATE_XR_FLAGS_INVALID) {
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,
                      "XrBodyJointLocationsHTC invalid member XrSpaceLocationFlags \"combinedLocationFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_350);
      std::operator<<((ostream *)local_330,local_350);
      std::__cxx11::string::~string(local_350);
      std::operator<<((ostream *)local_330," contains illegal bit");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_370,"VUID-XrBodyJointLocationsHTC-combinedLocationFlags-parameter",&local_371
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_390,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_370,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_390,local_3b0);
      std::__cxx11::string::~string((string *)local_3b0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_390);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_330);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,"XrBodyJointLocationsHTC",&local_3d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,"confidenceLevel",&local_3f9);
      bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_3d0,(string *)local_3f8,
                             objects_info,value->confidenceLevel);
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if ((value->jointLocationCount == 0) &&
           (value->jointLocations != (XrBodyJointLocationHTC *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_618,"VUID-XrBodyJointLocationsHTC-jointLocationCount-arraylength",
                     &local_619);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_638,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_658,
                     "Structure XrBodyJointLocationsHTC member jointLocationCount is non-optional and must be greater than 0"
                     ,&local_659);
          CoreValidLogMessage(instance_info,(string *)local_618,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_638,(string *)local_658);
          std::__cxx11::string::~string(local_658);
          std::allocator<char>::~allocator((allocator<char> *)&local_659);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_638);
          std::__cxx11::string::~string(local_618);
          std::allocator<char>::~allocator((allocator<char> *)&local_619);
          valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
        if ((value->jointLocations == (XrBodyJointLocationHTC *)0x0) &&
           (value->jointLocationCount != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_680,"VUID-XrBodyJointLocationsHTC-jointLocations-parameter",&local_681);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_6a0,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&value_jointlocations_inc,
                     "XrBodyJointLocationsHTC contains invalid NULL for XrBodyJointLocationHTC \"jointLocations\" is which not optional since \"jointLocationCount\" is set and must be non-NULL"
                     ,&local_6c1);
          CoreValidLogMessage(instance_info,(string *)local_680,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_6a0,(string *)&value_jointlocations_inc);
          std::__cxx11::string::~string((string *)&value_jointlocations_inc);
          std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_6a0);
          std::__cxx11::string::~string(local_680);
          std::allocator<char>::~allocator((allocator<char> *)&local_681);
          instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
        else {
          if (value->jointLocations != (XrBodyJointLocationHTC *)0x0) {
            for (local_6c8 = 0; local_6c8 < value->jointLocationCount; local_6c8 = local_6c8 + 1) {
              XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                       value->jointLocations + local_6c8);
              if (XVar3 != XR_SUCCESS) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_6e8,"VUID-XrBodyJointLocationsHTC-jointLocations-parameter",
                           &local_6e9);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_708,objects_info);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_728,
                           "Structure XrBodyJointLocationsHTC member jointLocations is invalid",
                           &local_729);
                CoreValidLogMessage(instance_info,(string *)local_6e8,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_708,
                                    (string *)local_728);
                std::__cxx11::string::~string(local_728);
                std::allocator<char>::~allocator((allocator<char> *)&local_729);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_708);
                std::__cxx11::string::~string(local_6e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
                return XVar3;
              }
              valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
            }
          }
          instance_info_local._4_4_ =
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_578);
        std::operator<<((ostream *)local_578,
                        "XrBodyJointLocationsHTC contains invalid XrBodyJointConfidenceHTC \"confidenceLevel\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_((uint32_t)local_598);
        std::operator<<((ostream *)local_578,local_598);
        std::__cxx11::string::~string(local_598);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5b8,"VUID-XrBodyJointLocationsHTC-confidenceLevel-parameter",&local_5b9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_5d8,objects_info);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(instance_info,(string *)local_5b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_5d8,local_5f8);
        std::__cxx11::string::~string((string *)local_5f8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_5d8);
        std::__cxx11::string::~string(local_5b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        std::__cxx11::ostringstream::~ostringstream(local_578);
      }
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBodyJointLocationsHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_BODY_JOINT_LOCATIONS_HTC) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrBodyJointLocationsHTC",
                             value->type, "VUID-XrBodyJointLocationsHTC-type-type", XR_TYPE_BODY_JOINT_LOCATIONS_HTC, "XR_TYPE_BODY_JOINT_LOCATIONS_HTC");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrBodyJointLocationsHTC struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrBodyJointLocationsHTC : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrBodyJointLocationsHTC struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->combinedLocationFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationsHTC invalid member XrSpaceLocationFlags \"combinedLocationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->combinedLocationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-combinedLocationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrBodyJointConfidenceHTC value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrBodyJointLocationsHTC", "confidenceLevel", objects_info, value->confidenceLevel)) {
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationsHTC contains invalid XrBodyJointConfidenceHTC \"confidenceLevel\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->confidenceLevel));
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-confidenceLevel-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->jointLocationCount && nullptr != value->jointLocations) {
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-jointLocationCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrBodyJointLocationsHTC member jointLocationCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->jointLocations && 0 != value->jointLocationCount) {
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-jointLocations-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrBodyJointLocationsHTC contains invalid NULL for XrBodyJointLocationHTC \"jointLocations\" is which not "
                            "optional since \"jointLocationCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->jointLocations) {
        for (uint32_t value_jointlocations_inc = 0; value_jointlocations_inc < value->jointLocationCount; ++value_jointlocations_inc) {
            // Validate that the structure XrBodyJointLocationHTC is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->jointLocations[value_jointlocations_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationsHTC-jointLocations-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrBodyJointLocationsHTC member jointLocations is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}